

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# d_ctl.c
# Opt level: O3

t_int * line_tilde_perf8(t_int *w)

{
  undefined4 *puVar1;
  undefined4 uVar2;
  long lVar3;
  t_int tVar4;
  int iVar5;
  long lVar6;
  int iVar7;
  long lVar8;
  float fVar9;
  float fVar10;
  
  lVar6 = w[1];
  lVar3 = w[2];
  tVar4 = w[3];
  fVar9 = *(float *)(lVar6 + 0x34);
  if ((((uint)fVar9 >> 0x1d ^ (uint)fVar9 >> 0x1e) & 1) == 0) {
    *(undefined4 *)(lVar6 + 0x34) = 0;
    fVar9 = 0.0;
  }
  iVar5 = (int)tVar4;
  if (*(int *)(lVar6 + 0x54) == 0) {
    iVar7 = *(int *)(lVar6 + 0x50);
    if (iVar7 == 0) {
      uVar2 = *(undefined4 *)(lVar6 + 0x30);
      *(undefined4 *)(lVar6 + 0x34) = uVar2;
      if (iVar5 != 0) {
        lVar6 = 0;
        do {
          puVar1 = (undefined4 *)(lVar3 + lVar6 * 4);
          *puVar1 = uVar2;
          puVar1[1] = uVar2;
          puVar1[2] = uVar2;
          puVar1[3] = uVar2;
          puVar1 = (undefined4 *)(lVar3 + 0x10 + lVar6 * 4);
          *puVar1 = uVar2;
          puVar1[1] = uVar2;
          puVar1[2] = uVar2;
          puVar1[3] = uVar2;
          lVar6 = lVar6 + 8;
        } while (iVar5 != (int)lVar6);
      }
      goto LAB_00119d17;
    }
  }
  else {
    iVar7 = (int)(*(float *)(lVar6 + 0x4c) * *(float *)(lVar6 + 0x44));
    iVar7 = iVar7 + (uint)(iVar7 == 0);
    fVar10 = (*(float *)(lVar6 + 0x30) - fVar9) / (float)iVar7;
    *(float *)(lVar6 + 0x38) = fVar10;
    *(float *)(lVar6 + 0x3c) = fVar10 * *(float *)(lVar6 + 0x40);
    *(undefined4 *)(lVar6 + 0x54) = 0;
  }
  if (iVar5 != 0) {
    lVar8 = 0;
    do {
      *(float *)(lVar3 + lVar8 * 4) = fVar9;
      fVar9 = fVar9 + *(float *)(lVar6 + 0x3c);
      lVar8 = lVar8 + 1;
    } while (iVar5 != (int)lVar8);
    fVar9 = *(float *)(lVar6 + 0x34);
  }
  *(float *)(lVar6 + 0x34) = fVar9 + *(float *)(lVar6 + 0x38);
  *(int *)(lVar6 + 0x50) = iVar7 + -1;
LAB_00119d17:
  return w + 4;
}

Assistant:

static t_int *line_tilde_perf8(t_int *w)
{
    t_line *x = (t_line *)(w[1]);
    t_sample *out = (t_sample *)(w[2]);
    int n = (int)(w[3]);
    t_sample f = x->x_value;

    if (PD_BIGORSMALL(f))
        x->x_value = f = 0;
    if (x->x_retarget)
    {
        int nticks = x->x_inletwas * x->x_dspticktomsec;
        if (!nticks) nticks = 1;
        x->x_ticksleft = nticks;
        x->x_biginc = (x->x_target - x->x_value)/(t_sample)nticks;
        x->x_inc = x->x_1overn * x->x_biginc;
        x->x_retarget = 0;
    }
    if (x->x_ticksleft)
    {
        t_sample f = x->x_value;
        while (n--) *out++ = f, f += x->x_inc;
        x->x_value += x->x_biginc;
        x->x_ticksleft--;
    }
    else
    {
        t_sample f = x->x_value = x->x_target;
        for (; n; n -= 8, out += 8)
        {
            out[0] = f; out[1] = f; out[2] = f; out[3] = f;
            out[4] = f; out[5] = f; out[6] = f; out[7] = f;
        }
    }
    return (w+4);
}